

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

bool __thiscall
semver::detail::token_stream::advanceIfMatch(token_stream *this,token *token,token_type type)

{
  token *ptVar1;
  undefined1 extraout_DL;
  undefined7 in_register_00000011;
  undefined7 extraout_var;
  token_stream *this_00;
  token_type local_38;
  token_type type_local;
  token *token_local;
  token_stream *this_local;
  
  this_00 = (token_stream *)this->current;
  ptVar1 = get((token *)this,this_00,CONCAT71(in_register_00000011,type));
  local_38 = (token_type)ptVar1;
  if (local_38 == type) {
    ptVar1 = advance((token *)this,this_00);
    *(token **)token = ptVar1;
    token->lexeme = (char *)CONCAT71(extraout_var,extraout_DL);
  }
  return local_38 == type;
}

Assistant:

SEMVER_CONSTEXPR bool advanceIfMatch(token& token, token_type type) noexcept {
    if (get(current).type != type) {
      return false;
    }

    token = advance();
    return true;
  }